

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ThreadSafeArena::ThreadSafeArena
          (ThreadSafeArena *this,char *mem,size_t size)

{
  ArenaBlock *pAVar1;
  
  this->tag_and_id_ = 0;
  (this->alloc_policy_).policy_ = 0;
  (this->mutex_).mu_.super___atomic_base<long>._M_i = 0;
  (this->head_)._M_b._M_p = (__pointer_type)0x0;
  pAVar1 = FirstBlock(this,mem,size);
  SerialArena::SerialArena(&this->first_arena_,pAVar1,this);
  Init(this);
  return;
}

Assistant:

ThreadSafeArena::ThreadSafeArena(char* mem, size_t size)
    : first_arena_(FirstSerialArena{}, FirstBlock(mem, size), *this) {
  Init();
}